

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_position.c
# Opt level: O0

void test_read_position(void)

{
  archive *v2;
  archive_entry *entry;
  void *unaff_retaddr;
  archive *in_stack_00000008;
  archive *in_stack_00000010;
  size_t i;
  size_t write_pos;
  archive_entry *ae;
  archive *a;
  archive_entry *in_stack_ffffffffffffffc8;
  void *extra;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  archive *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  archive *a_00;
  archive *in_stack_ffffffffffffffe8;
  
  assertion_assert(in_stack_ffffffffffffffe0,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  v2 = archive_write_new();
  assertion_assert(in_stack_ffffffffffffffe0,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  archive_write_set_format_pax_restricted(in_stack_ffffffffffffffd8);
  assertion_assert(in_stack_ffffffffffffffe0,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  archive_write_set_bytes_per_block(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  assertion_assert(in_stack_ffffffffffffffe0,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  archive_write_open_memory
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8,
             (size_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  assertion_assert(in_stack_ffffffffffffffe0,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  for (a_00 = (archive *)0x0; a_00 < (archive *)0x5; a_00 = (archive *)((long)&a_00->magic + 1)) {
    entry = archive_entry_new();
    assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
    archive_entry_set_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)in_stack_ffffffffffffffc8);
    archive_entry_set_mode(entry,0x8000);
    archive_entry_set_size(entry,data_sizes[(long)a_00]);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
    archive_entry_free((archive_entry *)0x1c64e8);
    in_stack_ffffffffffffffd8 = (archive *)data_sizes[(long)a_00];
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0x1c6513);
    assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  }
  archive_write_close((archive *)0x1c6560);
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffffd8,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (longlong)v2,(char *)0x1c658f,unaff_retaddr);
  archive_write_free((archive *)0x1c6599);
  extra = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffffd8,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0,
                      (char *)0x1c65c7,unaff_retaddr);
  archive_read_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  archive_read_support_format_tar(in_stack_00000008);
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  read_open_memory(a_00,in_stack_ffffffffffffffd8,
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_t)extra);
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  verify_read_positions(in_stack_00000010);
  archive_read_free((archive *)0x1c668d);
  archive_read_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  archive_read_support_format_tar(in_stack_00000008);
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  read_open_memory_minimal
            (a_00,in_stack_ffffffffffffffd8,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_t)extra);
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),extra);
  verify_read_positions(in_stack_00000010);
  archive_read_free((archive *)0x1c6753);
  return;
}

Assistant:

DEFINE_TEST(test_read_position)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t write_pos;
	size_t i;

	/* Sanity test */
	assert(sizeof(nulls) + 512 + 1024 <= sizeof(buff));

	/* Create an archive. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos));

	for (i = 0; i < sizeof(data_sizes)/sizeof(data_sizes[0]); ++i) {
		/* Create a simple archive_entry. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_pathname(ae, "testfile");
		archive_entry_set_mode(ae, S_IFREG);
		archive_entry_set_size(ae, data_sizes[i]);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
		assertA(data_sizes[i]
		    == (size_t)archive_write_data(a, nulls, sizeof(nulls)));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Read the archive back with a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

	/* Read the archive back without a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory_minimal(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

}